

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O0

jas_image_t * pnm_decode(jas_stream_t *in,char *optstr)

{
  _Bool _Var1;
  int iVar2;
  char *local_120;
  ulong local_110;
  size_t num_samples;
  pnm_dec_importopts_t opts;
  jas_image_cmptparm_t **ppjStack_f0;
  int i;
  jas_image_cmptparm_t *cmptparm;
  jas_image_cmptparm_t cmptparms [3];
  jas_image_t *image;
  pnm_hdr_t hdr;
  char *optstr_local;
  jas_stream_t *in_local;
  
  cmptparms[2].prec = 0;
  cmptparms[2].sgnd = 0;
  hdr._16_8_ = optstr;
  iVar2 = jas_getdbglevel();
  if (9 < iVar2) {
    if (hdr._16_8_ == 0) {
      local_120 = "";
    }
    else {
      local_120 = (char *)hdr._16_8_;
    }
    jas_eprintf("pnm_decode(%p, \"%s\")\n",in,local_120);
  }
  iVar2 = pnm_dec_parseopts((char *)hdr._16_8_,(pnm_dec_importopts_t *)&num_samples);
  if ((iVar2 == 0) && (iVar2 = pnm_gethdr(in,(pnm_hdr_t *)&image), iVar2 == 0)) {
    iVar2 = jas_getdbglevel();
    if (9 < iVar2) {
      jas_eprintf("magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
                  (long)(int)image,(long)image._4_4_,(long)hdr.magic,(ulong)(uint)hdr.width,
                  (long)hdr.height,(uint)((byte)hdr.numcmpts & 1));
    }
    if ((0 < image._4_4_) && (0 < hdr.magic)) {
      _Var1 = jas_safe_size_mul3((long)image._4_4_,(long)hdr.magic,(long)hdr.width,&local_110);
      if (_Var1) {
        if ((opts._0_8_ == 0) || (local_110 <= (ulong)opts._0_8_)) {
          ppjStack_f0 = &cmptparm;
          for (opts.max_samples._4_4_ = 0; opts.max_samples._4_4_ < hdr.width;
              opts.max_samples._4_4_ = opts.max_samples._4_4_ + 1) {
            *ppjStack_f0 = (jas_image_cmptparm_t *)0x0;
            ppjStack_f0[1] = (jas_image_cmptparm_t *)0x0;
            ppjStack_f0[2] = (jas_image_cmptparm_t *)0x1;
            ppjStack_f0[3] = (jas_image_cmptparm_t *)0x1;
            ppjStack_f0[4] = (jas_image_cmptparm_t *)(long)image._4_4_;
            ppjStack_f0[5] = (jas_image_cmptparm_t *)(long)hdr.magic;
            iVar2 = pnm_maxvaltodepth((long)hdr.height);
            *(int *)(ppjStack_f0 + 6) = iVar2;
            *(uint *)((long)ppjStack_f0 + 0x34) = (uint)((byte)hdr.numcmpts & 1);
            ppjStack_f0 = ppjStack_f0 + 7;
          }
          cmptparms[2]._48_8_ = jas_image_create(hdr.width,(jas_image_cmptparm_t *)&cmptparm,0x4000)
          ;
          if ((jas_image_t *)cmptparms[2]._48_8_ != (jas_image_t *)0x0) {
            if (hdr.width == 3) {
              ((jas_image_t *)cmptparms[2]._48_8_)->clrspc_ = 0x401;
              (*((jas_image_t *)cmptparms[2]._48_8_)->cmpts_)->type_ = 0;
              ((jas_image_t *)cmptparms[2]._48_8_)->cmpts_[1]->type_ = 1;
              ((jas_image_t *)cmptparms[2]._48_8_)->cmpts_[2]->type_ = 2;
            }
            else {
              ((jas_image_t *)cmptparms[2]._48_8_)->clrspc_ = 0x301;
              (*((jas_image_t *)cmptparms[2]._48_8_)->cmpts_)->type_ = 0;
            }
            iVar2 = pnm_getdata(in,(pnm_hdr_t *)&image,(jas_image_t *)cmptparms[2]._48_8_,
                                (int)num_samples);
            if (iVar2 == 0) {
              return (jas_image_t *)cmptparms[2]._48_8_;
            }
          }
        }
        else {
          jas_eprintf("maximum number of samples would be exceeded (%zu > %zu)\n",local_110,
                      opts._0_8_);
        }
      }
      else {
        jas_eprintf("image too large\n");
      }
    }
  }
  if (cmptparms[2]._48_8_ != 0) {
    jas_image_destroy((jas_image_t *)cmptparms[2]._48_8_);
  }
  return (jas_image_t *)0x0;
}

Assistant:

jas_image_t *pnm_decode(jas_stream_t *in, const char *optstr)
{
	pnm_hdr_t hdr;
	jas_image_t *image;
	jas_image_cmptparm_t cmptparms[3];
	jas_image_cmptparm_t *cmptparm;
	int i;
	pnm_dec_importopts_t opts;
	size_t num_samples;

	image = 0;

	JAS_DBGLOG(10, ("pnm_decode(%p, \"%s\")\n", in, optstr ? optstr : ""));

	if (pnm_dec_parseopts(optstr, &opts)) {
		goto error;
	}

	/* Read the file header. */
	if (pnm_gethdr(in, &hdr)) {
		goto error;
	}
	JAS_DBGLOG(10, (
	  "magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
	  JAS_CAST(unsigned long, hdr.magic), JAS_CAST(long, hdr.width),
	  JAS_CAST(long, hdr.height), hdr.numcmpts, JAS_CAST(long, hdr.maxval),
	  hdr.sgnd)
	  );

	if (hdr.width <= 0 || hdr.height <= 0) {
		goto error;
	}

	if (!jas_safe_size_mul3(hdr.width, hdr.height, hdr.numcmpts,
	  &num_samples)) {
		jas_eprintf("image too large\n");
		goto error;
	}
	if (opts.max_samples > 0 && num_samples > opts.max_samples) {
		jas_eprintf(
		  "maximum number of samples would be exceeded (%zu > %zu)\n",
		  num_samples, opts.max_samples);
		goto error;
	}

	/* Create an image of the correct size. */
	for (i = 0, cmptparm = cmptparms; i < hdr.numcmpts; ++i, ++cmptparm) {
		cmptparm->tlx = 0;
		cmptparm->tly = 0;
		cmptparm->hstep = 1;
		cmptparm->vstep = 1;
		cmptparm->width = hdr.width;
		cmptparm->height = hdr.height;
		cmptparm->prec = pnm_maxvaltodepth(hdr.maxval);
		cmptparm->sgnd = hdr.sgnd;
	}
	if (!(image = jas_image_create(hdr.numcmpts, cmptparms,
	  JAS_CLRSPC_UNKNOWN))) {
		goto error;
	}

	if (hdr.numcmpts == 3) {
		jas_image_setclrspc(image, JAS_CLRSPC_SRGB);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R));
		jas_image_setcmpttype(image, 1,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G));
		jas_image_setcmpttype(image, 2,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B));
	} else {
		jas_image_setclrspc(image, JAS_CLRSPC_SGRAY);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
	}

	/* Read image data from stream into image. */
	if (pnm_getdata(in, &hdr, image, opts.allow_trunc)) {
		goto error;
	}

	return image;

error:
	if (image) {
		jas_image_destroy(image);
	}
	return 0;
}